

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# return.c
# Opt level: O2

void contextsw(DLword fxnum,DLword bytenum,DLword flags)

{
  LispPTR *pLVar1;
  ushort uVar2;
  uint uVar3;
  LispPTR LVar4;
  DLword *pDVar5;
  ushort *puVar6;
  undefined6 in_register_0000003a;
  DLword *pDVar7;
  
  if ((flags & 1) == 0) {
    MachineState.pvar[-9] = MachineState.pvar[-9] | 0x100;
  }
  else {
    error("contextswitch sets Incall");
  }
  MachineState.pvar[-6] =
       bytenum + ((short)MachineState.currentpc - (short)MachineState.currentfunc);
  LVar4 = (LispPTR)CONCAT62(in_register_0000003a,fxnum);
  if ((flags & 2) == 0) {
    LVar4 = MachineState.tosvalue;
  }
  pLVar1 = (LispPTR *)(MachineState.csp + 2);
  MachineState.csp = MachineState.csp + 2;
  *pLVar1 = LVar4;
  MachineState.csp = MachineState.csp + 2;
  LVar4 = LAddrFromNative(MachineState.csp);
  MachineState.pvar[-5] = (DLword)LVar4;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xa000;
  *(short *)((ulong)(MachineState.csp + 1) ^ 2) =
       (short)((uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1);
  if (*(short *)((ulong)(MachineState.csp + 1) ^ 2) == 0) {
    error("creating 0-long free stack block.");
  }
  LVar4 = LAddrFromNative(MachineState.pvar + -10);
  puVar6 = (ushort *)((long)&InterfacePage->resetfxp + (ulong)((uint)fxnum * 2) ^ 2);
  MachineState.pvar = Stackspace + (ulong)*puVar6 + 10;
  *puVar6 = (ushort)LVar4;
  pDVar7 = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
  pDVar5 = pDVar7;
  if (*(short *)((ulong)pDVar7 ^ 2) != -0x6000) {
    error("contextsw(): MP9316");
  }
  while (*(short *)((ulong)pDVar5 ^ 2) == -0x6000) {
    MachineState.endofstack = pDVar5 + *(ushort *)((ulong)(pDVar5 + 1) ^ 2);
    pDVar5 = MachineState.endofstack;
  }
  uVar2 = MachineState.pvar[-9];
  if ((uVar2 >> 10 & 1) != 0) {
    error("return to frame with incall bit ");
    return;
  }
  if ((uVar2 >> 8 & 1) == 0) {
    MachineState.csp = pDVar7 + -2;
  }
  else {
    MachineState.pvar[-9] = uVar2 & 0xfaff;
    MachineState.tosvalue = *(LispPTR *)(pDVar7 + -2);
    MachineState.csp = pDVar7 + -4;
  }
  MachineState.ivar =
       (DLword *)
       ((ulong)((uint)*(ushort *)((ulong)(MachineState.pvar + -0xb) ^ 2) * 2) + (long)Stackspace);
  uVar3 = *(uint *)(MachineState.pvar + -8);
  if ((uVar3 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
  }
  MachineState.currentfunc = (fnhead *)(Lisp_world + uVar3);
  MachineState.currentpc =
       (ByteCode *)((long)&((fnhead *)(Lisp_world + uVar3))->na + (ulong)MachineState.pvar[-6]);
  return;
}

Assistant:

void contextsw(DLword fxnum, DLword bytenum, DLword flags)

/* BYTEnum that you want increment PC
      after CONTEXTSW */
/* 0bit(MSB) ON: incall mode */
/* 1bit ON : call from OP_contextsw */
/* I don't know that it is the possible case that
       flags is 3 . */
{
  DLword *next68k;
  DLword *freeptr; /* point to STK to be FSB */

#ifdef TRACE
  printf("contextsw : %d \n", fxnum);
#endif

  if (fxnum != SubovFXP) {
    /* interrupt disable during executing [special] function
      invoked by contextsw(\KEYHANDLER,\RESETSTACK,FAULT)
     */
  }

  if (flags & 1) /* INCALL? */
    error("contextswitch sets Incall");
  else
    CURRENTFX->nopush = T;

  /* store PC */
  CURRENTFX->pc = (UNSIGNED)PC - (UNSIGNED)FuncObj + bytenum;

  /* TOS save */
  if (flags & 2) {
    PushStack(fxnum);
    CurrentStackPTR += 2;
  } else {
    PushCStack;
    CurrentStackPTR += 2;
  }

  CURRENTFX->nextblock = LOLOC(LAddrFromNative(CurrentStackPTR));

  /* FSB set */
  GETWORD(CurrentStackPTR) = STK_FSB_WORD;
  GETWORD(CurrentStackPTR + 1) = (((UNSIGNED)EndSTKP - (UNSIGNED)CurrentStackPTR) >> 1);
  if (0 == GETWORD(CurrentStackPTR + 1)) error("creating 0-long free stack block.");
#ifdef STACKCHECK
  if (EndSTKP < CurrentStackPTR) error("contextsw:Illegal ESP");
#endif

  Midpunt(fxnum); /* exchanging FX */

  next68k = NativeAligned2FromStackOffset(CURRENTFX->nextblock);

  if (GETWORD(next68k) != STK_FSB_WORD) error("contextsw(): MP9316");
  freeptr = next68k;

  /* Merging FSB area */
  while (GETWORD(freeptr) == STK_FSB_WORD) EndSTKP = freeptr = freeptr + GETWORD(freeptr + 1);

#ifdef DEBUG
  printf("contextsw:ESTKP set ");
  laddr(EndSTKP);
#endif

  if (CURRENTFX->incall) {
    error("return to frame with incall bit ");
  } else {
    if (CURRENTFX->nopush) {
#ifdef DEBUG
      printf("context:after:nopush \n");
#endif

      CURRENTFX->nopush = NIL;
      CurrentStackPTR = next68k - 2;
      TopOfStack = *((LispPTR *)CurrentStackPTR);
      CurrentStackPTR -= 2;

    } else {
#ifdef DEBUG
      printf("context:after:3 \n");
#endif
      CurrentStackPTR = next68k - 2 /*-1*/; /* CHanged by Hayata */
    }

#ifdef STACKCHECK
    CHECKFX;
    if (EndSTKP < CurrentStackPTR) error("contextsw:Illegal ESP");
#endif
    FastRetCALL;
    return;
  }

}